

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O1

int cmime_message_from_string(CMimeMessage_T **message,char *content,int header_only)

{
  char *buffer;
  CMimeStringList_T *__ptr;
  int iVar1;
  char *buffer_00;
  _StrippedData_T *sd;
  
  if (*message == (CMimeMessage_T *)0x0) {
    __assert_fail("(*message)",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                  ,0x3f0,"int cmime_message_from_string(CMimeMessage_T **, const char *, int)");
  }
  if (content != (char *)0x0) {
    if ((uint)header_only < 2) {
      buffer_00 = strdup(content);
      sd = _strip_message(message,buffer_00,header_only);
      buffer = sd->stripped;
      iVar1 = cmime_scanner_scan_buffer(message,buffer);
      if (buffer != buffer_00) {
        _add_stripped_bodies(message,sd);
      }
      __ptr = sd->mime_bodies;
      free(__ptr->node);
      free(__ptr);
      free(sd);
      free(buffer_00);
      return iVar1;
    }
    __assert_fail("(header_only == 0)||(header_only == 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                  ,0x3f2,"int cmime_message_from_string(CMimeMessage_T **, const char *, int)");
  }
  __assert_fail("content",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                ,0x3f1,"int cmime_message_from_string(CMimeMessage_T **, const char *, int)");
}

Assistant:

int cmime_message_from_string(CMimeMessage_T **message, const char *content, int header_only) {
    _StrippedData_T *sd = NULL;
    int ret = 0;
    char *p = NULL;

    assert((*message));
    assert(content);
    assert((header_only == 0)||(header_only == 1));
  
    p = strdup(content);
    sd = _strip_message(message,p,header_only);
    
    ret = cmime_scanner_scan_buffer(message, sd->stripped);

    if (sd->stripped != p) {
        _add_stripped_bodies(message,sd);    
    }

    free(sd->mime_bodies->node);
    free(sd->mime_bodies);
    free(sd);
    free(p);

    return(ret);
}